

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiniFB_common.c
# Opt level: O1

_Bool mfb_set_viewport_best_fit(mfb_window *window,uint old_width,uint old_height)

{
  uint uVar1;
  uint uVar2;
  _Bool _Var3;
  ulong uVar4;
  ulong uVar5;
  float fVar6;
  float scale_x;
  float scale_y;
  float local_38;
  float local_34;
  
  if (window == (mfb_window *)0x0) {
    return false;
  }
  uVar1 = *(uint *)(window + 0x50);
  uVar2 = *(uint *)(window + 0x54);
  fVar6 = (float)uVar1 / (float)old_width;
  local_34 = (float)uVar2 / (float)old_height;
  if (fVar6 < local_34) {
    local_34 = fVar6;
  }
  uVar4 = (ulong)((float)old_width * local_34 + 0.5);
  uVar5 = (ulong)((float)old_height * local_34 + 0.5);
  local_38 = local_34;
  mfb_get_monitor_scale(window,&local_38,&local_34);
  _Var3 = mfb_set_viewport(window,(uint)(long)((float)(uVar1 - (int)uVar4 >> 1) / local_38),
                           (uint)(long)((float)(uVar2 - (int)uVar5 >> 1) / local_34),
                           (uint)(long)((float)(uVar4 & 0xffffffff) / local_38),
                           (uint)(long)((float)(uVar5 & 0xffffffff) / local_34));
  return _Var3;
}

Assistant:

bool
mfb_set_viewport_best_fit(struct mfb_window *window, unsigned old_width, unsigned old_height) {
    if(window != 0x0) {
        SWindowData *window_data = (SWindowData *) window;

        unsigned new_width  = window_data->window_width;
        unsigned new_height = window_data->window_height;

        float scale_x = new_width  / (float) old_width;
        float scale_y = new_height / (float) old_height;
        if(scale_x >= scale_y)
            scale_x = scale_y;
        else
            scale_y = scale_x;

        unsigned finalWidth  = (old_width  * scale_x) + 0.5f;
        unsigned finalHeight = (old_height * scale_y) + 0.5f;

        unsigned offset_x = (new_width  - finalWidth)  >> 1;
        unsigned offset_y = (new_height - finalHeight) >> 1;

        mfb_get_monitor_scale(window, &scale_x, &scale_y);
        return mfb_set_viewport(window, offset_x / scale_x, offset_y / scale_y, finalWidth / scale_x, finalHeight / scale_y);
    }

    return false;
}